

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O1

h__Reader * __thiscall
AS_02::TimedText::MXFReader::h__Reader::ReadTimedTextResource
          (h__Reader *this,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  AESDecContext *Ctx_00;
  long *local_48 [2];
  long local_38 [2];
  
  cVar4 = (**(code **)(**(long **)&FrameBuf->field_0x10 + 0x40))();
  if (cVar4 == '\0') {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    if (*(long *)&FrameBuf->field_0x8 == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0xb2,
                    "ASDCP::Result_t AS_02::TimedText::MXFReader::h__Reader::ReadTimedTextResource(ASDCP::TimedText::FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    Ctx_00 = (AESDecContext *)ASDCP::Dictionary::Type((MDD_t)*(long *)&FrameBuf->field_0x8);
    h__AS02Reader::ReadEKLVFrame
              (&this->super_h__AS02Reader,(ui32_t)FrameBuf,(FrameBuffer *)0x0,(byte_t *)Ctx,Ctx_00,
               HMAC);
    if (-1 < *(int *)&(this->super_h__AS02Reader).
                      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                      _vptr_TrackFileReader) {
      uVar1 = *(undefined4 *)&FrameBuf[0xf].field_0x20;
      uVar2 = *(undefined4 *)&FrameBuf[0xf].field_0x24;
      uVar3 = *(undefined4 *)FrameBuf[0xf].m_AssetID;
      *(undefined4 *)(Ctx + 0x28) = *(undefined4 *)&FrameBuf[0xf].field_0x1c;
      *(undefined4 *)(Ctx + 0x2c) = uVar1;
      *(undefined4 *)(Ctx + 0x30) = uVar2;
      *(undefined4 *)(Ctx + 0x34) = uVar3;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"text/xml","");
      std::__cxx11::string::_M_assign((string *)(Ctx + 0x38));
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFReader::h__Reader::ReadTimedTextResource(ASDCP::TimedText::FrameBuffer& FrameBuf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    {
      return RESULT_INIT;
    }

  assert(m_Dict);
  Result_t result = ReadEKLVFrame(0, FrameBuf, m_Dict->ul(MDD_TimedTextEssence), Ctx, HMAC);

 if( ASDCP_SUCCESS(result) )
   {
     FrameBuf.AssetID(m_TDesc.AssetID);
     FrameBuf.MIMEType("text/xml");
   }

 return result;
}